

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O2

bool __thiscall FIX::Dictionary::getBool(Dictionary *this,string *key)

{
  bool bVar1;
  string asStack_a8 [4];
  
  getString(asStack_a8,this,key,false);
  bVar1 = BoolConvertor::convert(asStack_a8);
  std::__cxx11::string::~string((string *)asStack_a8);
  return bVar1;
}

Assistant:

bool Dictionary::getBool( const std::string& key ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  try
  {
    return BoolConvertor::convert( getString(key) );
  }
  catch ( FieldConvertError& )
  {
    throw ConfigError( "Illegal value " + getString(key) + " for " + key );
  }
}